

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

int __thiscall
boost::runtime::enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0>::clone
          (enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *this,
          __fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *this_00;
  
  this_00 = (enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0> *)
            operator_new(0x138);
  enum_parameter(this_00,(enum_parameter<boost::unit_test::log_level,_(boost::runtime::args_amount)0>
                          *)__fn);
  shared_ptr<boost::runtime::basic_param>::
  shared_ptr<boost::runtime::enum_parameter<boost::unit_test::log_level,(boost::runtime::args_amount)0>>
            ((shared_ptr<boost::runtime::basic_param> *)this,this_00);
  return (int)this;
}

Assistant:

virtual basic_param_ptr clone() const
    {
        return basic_param_ptr( new enum_parameter( *this ) );
    }